

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Module.cpp
# Opt level: O2

void __thiscall w3Module::read_types(w3Module *this,uint8_t **cursor)

{
  byte bVar1;
  uint32_t uVar2;
  long lVar3;
  allocator<char> local_51;
  string local_50;
  
  printf("read_types1 offset:%lX\n",(long)*cursor - (long)this->base);
  uVar2 = read_varuint32(this,cursor);
  std::vector<w3FunctionType,_std::allocator<w3FunctionType>_>::resize
            (&this->function_types,(ulong)uVar2);
  for (lVar3 = 0; (ulong)uVar2 * 0x30 - lVar3 != 0; lVar3 = lVar3 + 0x30) {
    printf("read_types2 before marker offset:%lX\n",(long)*cursor - (long)this->base);
    bVar1 = read_byte(this,cursor);
    printf("read_types3 marker:%X offset:%lX\n",(ulong)bVar1,(long)*cursor - (long)this->base);
    if (bVar1 != 0x60) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"malformed2 in Types::read",&local_51);
      ThrowString(&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    read_function_type(this,(w3FunctionType *)
                            ((long)&(((this->function_types).
                                      super__Vector_base<w3FunctionType,_std::allocator<w3FunctionType>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->parameters).
                                    super__Vector_base<w3Tag,_std::allocator<w3Tag>_>._M_impl +
                            lVar3),cursor);
  }
  puts("read section 1");
  return;
}

Assistant:

void w3Module::read_types (uint8_t** cursor)
{
    printf ("read_types1 offset:%" FORMAT_SIZE "X\n", (long_t)(*cursor - this->base));
    const size_t size = read_varuint32 (cursor);
    function_types.resize (size);
    for (size_t i = 0; i < size; ++i)
    {
        printf ("read_types2 before marker offset:%" FORMAT_SIZE "X\n", (long_t)(*cursor - this->base));
        const uint32_t marker = read_byte (cursor);
        printf ("read_types3 marker:%X offset:%" FORMAT_SIZE "X\n", marker, (long_t)(*cursor - this->base));
        if (marker != 0x60)
            ThrowString ("malformed2 in Types::read");
        read_function_type (function_types [i], cursor);
    }
    printf ("read section 1\n");
}